

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O1

bool __thiscall ON_ClippingPlaneInfo::Read(ON_ClippingPlaneInfo *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  int minor_version;
  double d;
  int major_version;
  int local_34;
  double local_30;
  int local_24;
  
  (this->m_plane_id).Data1 = 0;
  (this->m_plane_id).Data2 = 0;
  (this->m_plane_id).Data3 = 0;
  (this->m_plane_id).Data4[0] = '\0';
  (this->m_plane_id).Data4[1] = '\0';
  (this->m_plane_id).Data4[2] = '\0';
  (this->m_plane_id).Data4[3] = '\0';
  (this->m_plane_id).Data4[4] = '\0';
  (this->m_plane_id).Data4[5] = '\0';
  (this->m_plane_id).Data4[6] = '\0';
  (this->m_plane_id).Data4[7] = '\0';
  (this->m_plane_equation).z = 0.0;
  (this->m_plane_equation).d = 0.0;
  (this->m_plane_equation).x = 0.0;
  (this->m_plane_equation).y = 0.0;
  this->m_bEnabled = false;
  this->m_depth_enabled = false;
  this->m_reserved[0] = '\0';
  this->m_reserved[1] = '\0';
  this->m_depth = 0.0;
  local_24 = 0;
  local_34 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,&local_24,&local_34);
  if (!bVar1) {
    return false;
  }
  bVar1 = local_24 == 1;
  if ((((!bVar1) ||
       (bVar1 = ON_BinaryArchive::ReadPlaneEquation(file,&this->m_plane_equation), !bVar1)) ||
      (bVar1 = ON_BinaryArchive::ReadUuid(file,&this->m_plane_id), !bVar1)) ||
     (bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_bEnabled), !bVar1)) goto LAB_0057443a;
  if (0 < local_34) {
    local_30 = 0.0;
    bVar1 = ON_BinaryArchive::ReadDouble(file,&local_30);
    if (!bVar1) goto LAB_0057443a;
    if (local_34 - 1U < 2) {
      if ((local_30 < 0.0) || ((local_30 == 1.2343210235867887e+38 && (!NAN(local_30))))) {
        this->m_depth_enabled = false;
        local_30 = 0.0;
      }
      else {
        this->m_depth_enabled = true;
      }
    }
    if (0.0 <= local_30) {
      this->m_depth = (float)local_30;
    }
    if (!bVar1) goto LAB_0057443a;
  }
  if (2 < local_34) {
    bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_depth_enabled);
  }
LAB_0057443a:
  bVar2 = ON_BinaryArchive::EndRead3dmChunk(file);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_ClippingPlaneInfo::Read( ON_BinaryArchive& file )
{
  Default();

  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;
  
  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    rc = file.ReadPlaneEquation(m_plane_equation);
    if (!rc) break;

    rc = file.ReadUuid(m_plane_id);
    if (!rc) break;

    rc = file.ReadBool(&m_bEnabled);
    if (!rc) break;

    if (minor_version > 0)
    {
      double d = 0;
      rc = file.ReadDouble(&d);
      if (!rc) break;

      if (1 == minor_version || 2 == minor_version)
      {
        if (d >= 0.0 && d != ON_UNSET_POSITIVE_FLOAT)
        {
          m_depth_enabled = true;
        }
        else
        {
          m_depth_enabled = false;
          d = 0.0;
        }
      }
      SetDepth(d);
    }

    if (minor_version >= 3)
    {
      rc = file.ReadBool(&m_depth_enabled);
      if (!rc) break;
    }

    break;
  }

  if ( !file.EndRead3dmChunk() )
    rc = false;

  return rc;
}